

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_7::Validator::CheckMemory(Validator *this,Location *loc,Memory *memory)

{
  char *format;
  
  if (this->current_memory_index_ == 1) {
    PrintError(this,loc,"only one memory block allowed");
  }
  CheckLimits(this,loc,&memory->page_limits,0x10000,"pages");
  if ((memory->page_limits).is_shared != true) {
    return;
  }
  if ((this->options_->features).threads_enabled_ == true) {
    if ((memory->page_limits).has_max != false) {
      return;
    }
    format = "shared memories must have max sizes";
  }
  else {
    format = "memories may not be shared";
  }
  PrintError(this,loc,format);
  return;
}

Assistant:

void Validator::CheckMemory(const Location* loc, const Memory* memory) {
  if (current_memory_index_ == 1) {
    PrintError(loc, "only one memory block allowed");
  }
  CheckLimits(loc, &memory->page_limits, WABT_MAX_PAGES, "pages");

  if (memory->page_limits.is_shared) {
    if (!options_.features.threads_enabled()) {
      PrintError(loc, "memories may not be shared");
    } else if (!memory->page_limits.has_max) {
      PrintError(loc, "shared memories must have max sizes");
    }
  }
}